

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaNtk.c
# Opt level: O2

int Cba_NtkCheckComboLoop_rec(Cba_Ntk_t *p,int iObj)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  iVar1 = Cba_ObjIsPi(p,iObj);
  iVar2 = 1;
  if (iVar1 == 0) {
    iVar1 = Cba_ObjCopy(p,iObj);
    if (iVar1 != 1) {
      iVar2 = Cba_ObjCopy(p,iObj);
      if (iVar2 == 0) {
LAB_002e0243:
        iVar2 = 0;
      }
      else {
        Cba_ObjSetCopy(p,iObj,0);
        iVar2 = Cba_ObjFin0(p,iObj);
        while( true ) {
          iVar1 = Cba_ObjFin0(p,iObj + 1);
          if (iVar1 <= iVar2) break;
          iVar1 = Cba_FinFon(p,iVar2);
          iVar1 = Cba_FonObj(p,iVar1);
          if (iVar1 != 0) {
            iVar3 = Cba_ObjIsSeq(p,iVar1);
            if (iVar3 == 0) {
              iVar1 = Cba_NtkCheckComboLoop_rec(p,iVar1);
              if (iVar1 == 0) goto LAB_002e0243;
            }
          }
          iVar2 = iVar2 + 1;
        }
        iVar2 = 1;
        Vec_IntSetEntry(&p->vObjCopy,iObj,1);
      }
    }
  }
  return iVar2;
}

Assistant:

int Cba_NtkCheckComboLoop_rec( Cba_Ntk_t * p, int iObj )
{
    int k, iFin, iFanin;
    if ( Cba_ObjIsPi(p, iObj) )
        return 1;
    if ( Cba_ObjCopy(p, iObj) == 1 ) // visited
        return 1;
    if ( Cba_ObjCopy(p, iObj) == 0 ) // loop
        return 0;
    Cba_ObjSetCopy( p, iObj, 0 );
    Cba_ObjForEachFinFaninReal( p, iObj, iFin, iFanin, k )
        if ( !Cba_ObjIsSeq(p, iFanin) )
            if ( !Cba_NtkCheckComboLoop_rec( p, iFanin ) )
                return 0;
    //Cba_ObjSetCopy( p, iObj, 1 );
    Vec_IntSetEntry( &p->vObjCopy, iObj, 1 );
    return 1;
}